

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>::fastAccessDx
          (value_type *__return_storage_ptr__,
          FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_> *this,int i)

{
  int iVar1;
  Fad<double> *pFVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  
  pFVar2 = (this->right_->dx_).ptr_to_data;
  __return_storage_ptr__->val_ = -pFVar2[i].val_;
  iVar1 = pFVar2[i].dx_.num_elts;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (0 < (long)iVar1) {
    (__return_storage_ptr__->dx_).num_elts = iVar1;
    pdVar3 = (double *)operator_new__((long)iVar1 << 3);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar3;
  }
  __return_storage_ptr__->defaultVal = 0.0;
  lVar4 = (long)pFVar2[i].dx_.num_elts;
  if (0 < lVar4) {
    pdVar3 = (__return_storage_ptr__->dx_).ptr_to_data;
    lVar5 = 0;
    do {
      pdVar3[lVar5] = -pFVar2[i].dx_.ptr_to_data[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return - right_.fastAccessDx(i);}